

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

void __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,
          pair<unsigned_long,_const_cppjieba::DictUnit_*> *t)

{
  size_t sVar1;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *t_local;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this_local;
  
  if (this->size_ == this->capacity_) {
    if (this->capacity_ == 0) {
      __assert_fail("capacity_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/limonp/LocalVector.hpp"
                    ,0x52,
                    "void limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::push_back(const T &) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    reserve(this,this->capacity_ << 1);
  }
  sVar1 = this->size_;
  this->size_ = sVar1 + 1;
  std::pair<unsigned_long,_const_cppjieba::DictUnit_*>::operator=(this->ptr_ + sVar1,t);
  return;
}

Assistant:

void push_back(const T& t) {
    if(size_ == capacity_) {
      assert(capacity_);
      reserve(capacity_ * 2);
    }
    ptr_[size_ ++ ] = t;
  }